

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioWriteList.c
# Opt level: O1

void Io_WriteListEdge(FILE *pFile,Abc_Obj_t *pObj)

{
  Abc_Obj_t *pObj_00;
  char *pcVar1;
  ulong uVar2;
  
  pcVar1 = Abc_ObjName(pObj);
  fprintf((FILE *)pFile,"%-10s >    ",pcVar1);
  if (0 < (pObj->vFanouts).nSize) {
    uVar2 = 0;
    do {
      pObj_00 = (Abc_Obj_t *)pObj->pNtk->vObjs->pArray[(pObj->vFanouts).pArray[uVar2]];
      pcVar1 = Abc_ObjName(pObj_00);
      fprintf((FILE *)pFile," %s",pcVar1);
      pcVar1 = Abc_ObjName(pObj);
      fprintf((FILE *)pFile," ([%s_to_",pcVar1);
      pcVar1 = Abc_ObjName(pObj_00);
      fprintf((FILE *)pFile,"%s] = %d)",pcVar1,0);
      if (uVar2 != (pObj->vFanouts).nSize - 1) {
        fputc(0x2c,(FILE *)pFile);
      }
      uVar2 = uVar2 + 1;
    } while ((long)uVar2 < (long)(pObj->vFanouts).nSize);
  }
  fputc(0x2e,(FILE *)pFile);
  fputc(10,(FILE *)pFile);
  return;
}

Assistant:

void Io_WriteListEdge( FILE * pFile, Abc_Obj_t * pObj )
{
    Abc_Obj_t * pFanout;
    int i;
    fprintf( pFile, "%-10s >    ", Abc_ObjName(pObj) );
    Abc_ObjForEachFanout( pObj, pFanout, i )
    {
        fprintf( pFile, " %s", Abc_ObjName(pFanout) );
        fprintf( pFile, " ([%s_to_", Abc_ObjName(pObj) );
//        fprintf( pFile, "%s] = %d)", Abc_ObjName(pFanout), Seq_ObjFanoutL(pObj, pFanout) );
        fprintf( pFile, "%s] = %d)", Abc_ObjName(pFanout), 0 );
        if ( i != Abc_ObjFanoutNum(pObj) - 1 )
            fprintf( pFile, "," );
    }
    fprintf( pFile, "." );
    fprintf( pFile, "\n" );
}